

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int archive_read_format_mtree_options(archive_read *a,char *key,char *val)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  mtree *mtree;
  int local_4;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  iVar2 = strcmp(in_RSI,"checkfs");
  if (iVar2 == 0) {
    if ((in_RDX == (char *)0x0) || (*in_RDX == '\0')) {
      *(undefined1 *)(lVar1 + 0x90) = 0;
    }
    else {
      *(undefined1 *)(lVar1 + 0x90) = 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_mtree_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (strcmp(key, "checkfs")  == 0) {
		/* Allows to read information missing from the mtree from the file system */
		if (val == NULL || val[0] == 0) {
			mtree->checkfs = 0;
		} else {
			mtree->checkfs = 1;
		}
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}